

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_20de8f::NullBackend::open(NullBackend *this,char *__file,int __oflag,...)

{
  int iVar1;
  backend_exception *this_00;
  char *local_10;
  
  if (__file == (char *)0x0) {
    local_10 = "No Output";
  }
  else {
    iVar1 = strcmp(__file,"No Output");
    local_10 = __file;
    if (iVar1 != 0) {
      this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception(this_00,0xa004,"Device name \"%s\" not found",__file)
      ;
      __cxa_throw(this_00,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception
                 );
    }
  }
  iVar1 = std::__cxx11::string::operator=
                    ((string *)&((this->super_BackendBase).mDevice)->DeviceName,local_10);
  return iVar1;
}

Assistant:

void NullBackend::open(const ALCchar *name)
{
    if(!name)
        name = nullDevice;
    else if(strcmp(name, nullDevice) != 0)
        throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};

    mDevice->DeviceName = name;
}